

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::BlockStatement::tokenize(BlockStatement *this,GeneratorState *state,TokenStream *str)

{
  bool bVar1;
  TokenStream *pTVar2;
  reference ppSVar3;
  Token local_a8;
  Token local_98;
  Token local_88;
  reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
  local_78;
  undefined1 local_70 [16];
  const_reverse_iterator i;
  Token local_50 [2];
  Token local_30;
  TokenStream *local_20;
  TokenStream *str_local;
  GeneratorState *state_local;
  BlockStatement *this_local;
  
  local_20 = str;
  str_local = (TokenStream *)state;
  state_local = (GeneratorState *)this;
  Token::Token(&local_30,LEFT_BRACE);
  pTVar2 = TokenStream::operator<<(str,&local_30);
  Token::Token(local_50,NEWLINE);
  pTVar2 = TokenStream::operator<<(pTVar2,local_50);
  Token::Token((Token *)&i,INDENT_INC);
  TokenStream::operator<<(pTVar2,(Token *)&i);
  Token::~Token((Token *)&i);
  Token::~Token(local_50);
  Token::~Token(&local_30);
  std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::rbegin
            ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)(local_70 + 8));
  while( true ) {
    std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>::rend
              ((vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_> *)local_70);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
                             *)(local_70 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
                             *)local_70);
    pTVar2 = local_20;
    if (!bVar1) break;
    ppSVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
                           *)(local_70 + 8));
    (*(*ppSVar3)->_vptr_Statement[3])(*ppSVar3,str_local,local_20);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rsg::Statement_*const_*,_std::vector<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>_>_>
    ::operator++(&local_78,(int)local_70 + 8);
  }
  Token::Token(&local_88,INDENT_DEC);
  pTVar2 = TokenStream::operator<<(pTVar2,&local_88);
  Token::Token(&local_98,RIGHT_BRACE);
  pTVar2 = TokenStream::operator<<(pTVar2,&local_98);
  Token::Token(&local_a8,NEWLINE);
  TokenStream::operator<<(pTVar2,&local_a8);
  Token::~Token(&local_a8);
  Token::~Token(&local_98);
  Token::~Token(&local_88);
  return;
}

Assistant:

void BlockStatement::tokenize (GeneratorState& state, TokenStream& str) const
{
	str << Token::LEFT_BRACE << Token::NEWLINE << Token::INDENT_INC;

	for (vector<Statement*>::const_reverse_iterator i = m_children.rbegin(); i != m_children.rend(); i++)
		(*i)->tokenize(state, str);

	str << Token::INDENT_DEC << Token::RIGHT_BRACE << Token::NEWLINE;
}